

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

bool __thiscall DependencyScan::RecomputeDirty(DependencyScan *this,Node *node,string *err)

{
  bool bVar1;
  vector<Node_*,_std::allocator<Node_*>_> stack;
  _Vector_base<Node_*,_std::allocator<Node_*>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = RecomputeDirty(this,node,(vector<Node_*,_std::allocator<Node_*>_> *)&local_28,err);
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base(&local_28);
  return bVar1;
}

Assistant:

bool DependencyScan::RecomputeDirty(Node* node, string* err) {
  vector<Node*> stack;
  return RecomputeDirty(node, &stack, err);
}